

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.h
# Opt level: O2

void __thiscall datarate_test::anon_unknown_0::DatarateTest::EndPassHook(DatarateTest *this)

{
  long lVar1;
  double dVar2;
  
  dVar2 = (double)(this->last_pts_ + 1) * this->timebase_;
  this->duration_ = dVar2;
  this->effective_datarate_ = ((double)this->bits_total_ / 1000.0) / dVar2;
  if (0 < this->frame_update_bitrate_) {
    for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
      *(double *)((long)this->bits_total_dynamic_ + lVar1 * 2) =
           (((double)*(long *)((long)this->frame_number_dynamic_ + lVar1 * 2) / 1000.0) * 30.0) /
           (double)*(int *)((long)this->frame_number_dynamic_ + lVar1 + 0xc);
    }
  }
  return;
}

Assistant:

void EndPassHook() override {
    duration_ = (last_pts_ + 1) * timebase_;
    // Effective file datarate:
    effective_datarate_ = (bits_total_ / 1000.0) / duration_;
    if (frame_update_bitrate_ > 0) {
      for (int i = 0; i < 3; i++)
        effective_datarate_dynamic_[i] =
            30 * (bits_total_dynamic_[i] / 1000.0) / frame_number_dynamic_[i];
    }
  }